

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O1

void __thiscall Timidity::Renderer::drop_sustain(Renderer *this,int chan)

{
  int i;
  long lVar1;
  long lVar2;
  
  i = this->voices;
  lVar2 = (long)i;
  if (lVar2 != 0) {
    lVar1 = lVar2 * 0x170 + -0x16f;
    do {
      i = i + -1;
      if (((uint)(&this->voice->status)[lVar1] == chan) &&
         ((*(byte *)((long)this->voice + lVar1 + -1) & 0x20) != 0)) {
        finish_note(this,i);
      }
      lVar2 = lVar2 + -1;
      lVar1 = lVar1 + -0x170;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

void Renderer::drop_sustain(int chan)
{
	int i = voices;
	while (i--)
	{
		if (voice[i].channel == chan && (voice[i].status & NOTE_SUSTAIN))
		{
			finish_note(i);
		}
	}
}